

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* testing::internal::anon_unknown_98::SplitEscapedString
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *str)

{
  char cVar1;
  char *pcVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar5 = str->_M_string_length;
  if ((uVar5 < 3) || (pcVar2 = (str->_M_dataplus)._M_p, *pcVar2 != '\"')) {
    uVar4 = 0;
  }
  else {
    bVar6 = pcVar2[uVar5 - 1] == '\"';
    uVar4 = (ulong)bVar6;
    if (bVar6) {
      uVar5 = uVar5 - 1;
    }
  }
LAB_00136dbe:
  bVar6 = false;
  lVar3 = 1;
  do {
    if (uVar5 <= uVar4 + lVar3) {
      std::__cxx11::string::substr((ulong)&local_50,(ulong)str);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      return __return_storage_ptr__;
    }
    cVar1 = (str->_M_dataplus)._M_p[lVar3 + (uVar4 - 1)];
    if (bVar6) {
      if (cVar1 == 'n') break;
      bVar6 = false;
    }
    else {
      bVar6 = cVar1 == '\\';
    }
    lVar3 = lVar3 + 1;
  } while( true );
  std::__cxx11::string::substr((ulong)&local_50,(ulong)str);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  uVar4 = uVar4 + lVar3;
  goto LAB_00136dbe;
}

Assistant:

std::vector<std::string> SplitEscapedString(const std::string& str) {
  std::vector<std::string> lines;
  size_t start = 0, end = str.size();
  if (end > 2 && str[0] == '"' && str[end - 1] == '"') {
    ++start;
    --end;
  }
  bool escaped = false;
  for (size_t i = start; i + 1 < end; ++i) {
    if (escaped) {
      escaped = false;
      if (str[i] == 'n') {
        lines.push_back(str.substr(start, i - start - 1));
        start = i + 1;
      }
    } else {
      escaped = str[i] == '\\';
    }
  }
  lines.push_back(str.substr(start, end - start));
  return lines;
}